

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O0

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair::
metric_pair<std::array<std::__cxx11::string,2ul>const&>
          (metric_pair *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *first)

{
  rep rVar1;
  pointer paVar2;
  thread_local_value<long> *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_00000008;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_00000010;
  thread_local_value<long> *this_00;
  
  this_00 = in_RDI;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(in_stack_00000010,in_stack_00000008);
  this_00[2].duplicates_.
  super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::atomic<double>::atomic((atomic<double> *)0x26b212);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this_00);
  thread_local_value<long>::inc(this_00,(long)in_RDI);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)&ylt_label_max_age);
  if (rVar1 != 0) {
    paVar2 = (pointer)std::chrono::_V2::steady_clock::now();
    in_RDI[2].duplicates_.
    super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  return;
}

Assistant:

metric_pair(T&& first, Args&&... args)
        : label(std::forward<T>(first)), value(std::forward<Args>(args)...) {
      g_user_metric_label_count->inc();
      if (ylt_label_max_age.count()) {
        tp = std::chrono::steady_clock::now();
      }
    }